

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRect __thiscall QRenderRule::outlineRect(QRenderRule *this,QRect *r)

{
  QStyleSheetOutlineData *pQVar1;
  QRect QVar2;
  
  QVar2 = borderRect(this,r);
  pQVar1 = (this->ou).d.ptr;
  if (pQVar1 != (QStyleSheetOutlineData *)0x0) {
    QVar2.y1.m_i = (r->y1).m_i + (pQVar1->super_QStyleSheetBorderData).borders[0];
    QVar2.x1.m_i = (r->x1).m_i + (pQVar1->super_QStyleSheetBorderData).borders[3];
    QVar2.y2.m_i = (r->y2).m_i - (pQVar1->super_QStyleSheetBorderData).borders[2];
    QVar2.x2.m_i = (r->x2).m_i - (pQVar1->super_QStyleSheetBorderData).borders[1];
  }
  return QVar2;
}

Assistant:

QRect QRenderRule::outlineRect(const QRect& r) const
{
    QRect br = borderRect(r);
    if (!hasOutline())
        return br;
    const int *b = outline()->borders;
    return r.adjusted(b[LeftEdge], b[TopEdge], -b[RightEdge], -b[BottomEdge]);
}